

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

int cQuerySpace(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int panel_size;
  int dword;
  int iword;
  int n;
  NCformat *Ustore;
  SCformat *Lstore;
  mem_usage_t *mem_usage_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  
  iVar3 = sp_ienv(1);
  pvVar2 = U->Store;
  iVar1 = L->ncol;
  mem_usage->for_lu =
       ((float)iVar1 * 4.0 + 3.0) * 4.0 +
       (float)(*(int *)(*(long *)((long)L->Store + 0x10) + (long)iVar1 * 4) * 8) +
       (float)(*(int *)(*(long *)((long)L->Store + 0x20) + (long)iVar1 * 4) * 4);
  mem_usage->for_lu =
       ((float)iVar1 + 1.0) * 4.0 +
       (float)(*(int *)(*(long *)((long)pvVar2 + 0x18) + (long)iVar1 * 4) * 0xc) + mem_usage->for_lu
  ;
  mem_usage->total_needed =
       mem_usage->for_lu +
       ((float)iVar3 + (float)iVar3 + 4.0 + 3.0) * (float)iVar1 * 4.0 +
       ((float)iVar3 + 1.0) * (float)iVar1 * 8.0;
  return 0;
}

Assistant:

int cQuerySpace(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage)
{
    SCformat *Lstore;
    NCformat *Ustore;
    register int n, iword, dword, panel_size = sp_ienv(1);

    Lstore = L->Store;
    Ustore = U->Store;
    n = L->ncol;
    iword = sizeof(int);
    dword = sizeof(singlecomplex);

    /* For LU factors */
    mem_usage->for_lu = (float)( (4.0*n + 3.0) * iword +
                                 Lstore->nzval_colptr[n] * dword +
                                 Lstore->rowind_colptr[n] * iword );
    mem_usage->for_lu += (float)( (n + 1.0) * iword +
				 Ustore->colptr[n] * (dword + iword) );

    /* Working storage to support factorization */
    mem_usage->total_needed = mem_usage->for_lu +
	(float)( (2.0 * panel_size + 4.0 + NO_MARKER) * n * iword +
		(panel_size + 1.0) * n * dword );

    return 0;
}